

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

bool __thiscall
phpconvert::ZendParser::isInMainTypes(ZendParser *this,File *file,PreparedType *preparedType)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  PreparedType *local_20;
  PreparedType *preparedType_local;
  File *file_local;
  ZendParser *this_local;
  
  local_20 = preparedType;
  preparedType_local = (PreparedType *)file;
  file_local = (File *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(file->mainTypes,&preparedType->type);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(preparedType_local->implements).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
  bVar1 = std::operator!=(&local_28,&local_30);
  return bVar1;
}

Assistant:

bool ZendParser::isInMainTypes(const BaseParser::File &file, const BaseParser::PreparedType &preparedType) const {
        return file.mainTypes->find(preparedType.type)
               != file.mainTypes->end();
    }